

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

UtxoData * __thiscall
cfd::Psbt::GetUtxoData(UtxoData *__return_storage_ptr__,Psbt *this,uint32_t index,NetType net_type)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  uint8_t *puVar4;
  pointer pKVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  AddressType AVar9;
  CfdException *pCVar10;
  long lVar11;
  pointer this_00;
  long lVar12;
  Pubkey *this_01;
  Script *this_02;
  DescriptorScriptReference *this_03;
  Script *pSVar13;
  long lVar14;
  allocator local_779;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  ByteData last_data_1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_730;
  int64_t *local_718;
  string *local_710;
  NetType local_704;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_700;
  Script *local_6e8;
  Pubkey *local_6e0;
  Script scriptsig;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_560;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_548;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_530;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_518;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_500;
  DescriptorScriptReference ref;
  ByteData last_data;
  
  local_704 = net_type;
  (*(this->super_Psbt)._vptr_Psbt[2])(this,(ulong)index,0x2d2,"GetUtxoData");
  pvVar2 = (this->super_Psbt).wally_psbt_pointer_;
  UtxoData::UtxoData(__return_storage_ptr__);
  __return_storage_ptr__->block_height = 0;
  __return_storage_ptr__->address_type = kP2shAddress;
  lVar14 = (ulong)index * 0xd0;
  core::ByteData::ByteData
            (&last_data,(uint8_t *)(*(long *)(*(long *)((long)pvVar2 + 8) + 8) + lVar14),0x20);
  core::ByteData256::ByteData256((ByteData256 *)&scriptsig,&last_data);
  core::Txid::Txid((Txid *)&ref,(ByteData256 *)&scriptsig);
  core::Txid::operator=(&__return_storage_ptr__->txid,(Txid *)&ref);
  core::Txid::~Txid((Txid *)&ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptsig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&last_data);
  uVar1 = *(uint *)(*(long *)(*(long *)((long)pvVar2 + 8) + 8) + 0x20 + lVar14);
  __return_storage_ptr__->vout = uVar1;
  lVar14 = (ulong)index * 0x110;
  local_718 = *(int64_t **)(*(long *)((long)pvVar2 + 0x10) + 8 + lVar14);
  if (local_718 == (int64_t *)0x0) {
    lVar11 = *(long *)(*(long *)((long)pvVar2 + 0x10) + lVar14);
    if ((lVar11 != 0) && ((ulong)uVar1 < *(ulong *)(lVar11 + 0x28))) {
      lVar11 = *(long *)(lVar11 + 0x20);
      lVar12 = (ulong)uVar1 * 0x70;
      core::Amount::Amount((Amount *)&ref,*(int64_t *)(lVar11 + lVar12));
      lVar11 = lVar11 + lVar12;
      (__return_storage_ptr__->amount).ignore_check_ = (bool)ref.locking_script_._vptr_Script._0_1_;
      (__return_storage_ptr__->amount).amount_ = ref._0_8_;
      core::ByteData::ByteData
                ((ByteData *)&scriptsig,*(uint8_t **)(lVar11 + 8),*(uint32_t *)(lVar11 + 0x10));
      core::Script::Script((Script *)&ref,(ByteData *)&scriptsig);
      core::Script::operator=(&__return_storage_ptr__->locking_script,(Script *)&ref);
      goto LAB_0032bc2a;
    }
  }
  else {
    core::Amount::Amount((Amount *)&ref,*local_718);
    (__return_storage_ptr__->amount).ignore_check_ = (bool)ref.locking_script_._vptr_Script._0_1_;
    (__return_storage_ptr__->amount).amount_ = ref._0_8_;
    lVar11 = *(long *)(*(long *)((long)pvVar2 + 0x10) + 8 + lVar14);
    core::ByteData::ByteData
              ((ByteData *)&scriptsig,*(uint8_t **)(lVar11 + 8),*(uint32_t *)(lVar11 + 0x10));
    core::Script::Script((Script *)&ref,(ByteData *)&scriptsig);
    core::Script::operator=(&__return_storage_ptr__->locking_script,(Script *)&ref);
LAB_0032bc2a:
    core::Script::~Script((Script *)&ref);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptsig);
  }
  this_02 = &__return_storage_ptr__->locking_script;
  bVar6 = core::Script::IsP2shScript(this_02);
  if (bVar6) {
    AVar9 = kP2shAddress;
LAB_0032bd24:
    __return_storage_ptr__->address_type = AVar9;
  }
  else {
    bVar6 = core::Script::IsP2pkhScript(this_02);
    if (bVar6) {
      AVar9 = kP2pkhAddress;
      goto LAB_0032bd24;
    }
    bVar6 = core::Script::IsP2wpkhScript(this_02);
    if (bVar6) {
      AVar9 = kP2wpkhAddress;
      goto LAB_0032bd24;
    }
    bVar6 = core::Script::IsP2wshScript(this_02);
    if (bVar6) {
      AVar9 = kP2wshAddress;
      goto LAB_0032bd24;
    }
  }
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = core::Psbt::IsFinalizedInput(&this->super_Psbt,index);
  lVar11 = *(long *)((long)pvVar2 + 0x10);
  if (bVar6) {
    if ((local_718 == (int64_t *)0x0) ||
       (plVar3 = *(long **)(lVar11 + 0x40 + lVar14), plVar3 == (long *)0x0)) {
      puVar4 = *(uint8_t **)(lVar11 + 0x30 + lVar14);
      if (puVar4 != (uint8_t *)0x0) {
        core::ByteData::ByteData((ByteData *)&ref,puVar4,*(uint32_t *)(lVar11 + 0x38 + lVar14));
        core::Script::Script(&scriptsig,(ByteData *)&ref);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ref);
        core::Script::GetElementList(&items,&scriptsig);
        iVar8 = (int)(((long)items.
                             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT44(items.
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint)items.
                                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                     ._M_impl.super__Vector_impl_data._M_start)) / 0x60);
        if (iVar8 != 0) {
          core::ScriptElement::GetBinaryData
                    (&last_data_1,
                     (ScriptElement *)
                     (CONCAT44(items.
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint)items.
                                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                     ._M_impl.super__Vector_impl_data._M_start) +
                     (ulong)(iVar8 - 1) * 0x60));
          bVar6 = core::Pubkey::IsValid(&last_data_1);
          if (bVar6) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_530,
                       &last_data_1.data_);
            core::Pubkey::Pubkey((Pubkey *)&local_730,(ByteData *)&local_530);
            std::__cxx11::string::string((string *)&last_data,"",(allocator *)&local_560);
            core::ByteData::ByteData((ByteData *)&local_700);
            core::KeyData::KeyData
                      ((KeyData *)&ref,(Pubkey *)&local_730,(string *)&last_data,
                       (ByteData *)&local_700);
            std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
            emplace_back<cfd::core::KeyData>(&key_list,(KeyData *)&ref);
            core::KeyData::~KeyData((KeyData *)&ref);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_700);
            std::__cxx11::string::~string((string *)&last_data);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_730);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_530);
          }
          else {
            core::Script::Script((Script *)&ref,&last_data_1);
            pSVar13 = &__return_storage_ptr__->redeem_script;
            core::Script::operator=(pSVar13,(Script *)&ref);
            core::Script::~Script((Script *)&ref);
            bVar6 = core::Script::IsP2pkScript(pSVar13);
            if (bVar6) {
              core::Script::GetElementList
                        ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          *)&local_700,pSVar13);
              core::ScriptElement::GetData
                        ((ByteData *)&local_548,
                         (ScriptElement *)local_700._M_impl.super__Vector_impl_data._M_start);
              core::Pubkey::Pubkey((Pubkey *)&local_730,(ByteData *)&local_548);
              std::__cxx11::string::string((string *)&last_data,"",&local_779);
              core::ByteData::ByteData((ByteData *)&local_560);
              core::KeyData::KeyData
                        ((KeyData *)&ref,(Pubkey *)&local_730,(string *)&last_data,
                         (ByteData *)&local_560);
              std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
              emplace_back<cfd::core::KeyData>(&key_list,(KeyData *)&ref);
              core::KeyData::~KeyData((KeyData *)&ref);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_560);
              std::__cxx11::string::~string((string *)&last_data);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_730);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_548);
              std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              ~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *
                      )&local_700);
            }
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&last_data_1);
        }
        std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  (&items);
        core::Script::~Script(&scriptsig);
      }
    }
    else if ((int)plVar3[1] != 0) {
      lVar14 = (ulong)((int)plVar3[1] - 1) * 0x10;
      core::ByteData::ByteData
                (&last_data,*(uint8_t **)(*plVar3 + lVar14),*(uint32_t *)(*plVar3 + 8 + lVar14));
      bVar6 = core::Pubkey::IsValid(&last_data);
      if (bVar6) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_500,
                   &last_data.data_);
        core::Pubkey::Pubkey((Pubkey *)&items,(ByteData *)&local_500);
        std::__cxx11::string::string((string *)&scriptsig,"",(allocator *)&local_730);
        core::ByteData::ByteData(&last_data_1);
        core::KeyData::KeyData((KeyData *)&ref,(Pubkey *)&items,(string *)&scriptsig,&last_data_1);
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
        emplace_back<cfd::core::KeyData>(&key_list,(KeyData *)&ref);
        core::KeyData::~KeyData((KeyData *)&ref);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&last_data_1);
        std::__cxx11::string::~string((string *)&scriptsig);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&items);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_500);
        if (__return_storage_ptr__->address_type == kP2shAddress) {
          __return_storage_ptr__->address_type = kP2shP2wpkhAddress;
        }
      }
      else {
        core::Script::Script((Script *)&ref,&last_data);
        pSVar13 = &__return_storage_ptr__->redeem_script;
        core::Script::operator=(pSVar13,(Script *)&ref);
        core::Script::~Script((Script *)&ref);
        if (__return_storage_ptr__->address_type == kP2shAddress) {
          __return_storage_ptr__->address_type = kP2shP2wshAddress;
        }
        bVar6 = core::Script::IsP2pkScript(pSVar13);
        if (bVar6) {
          core::Script::GetElementList
                    ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                     &last_data_1,pSVar13);
          core::ScriptElement::GetData
                    ((ByteData *)&local_518,
                     (ScriptElement *)
                     last_data_1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
          core::Pubkey::Pubkey((Pubkey *)&items,(ByteData *)&local_518);
          std::__cxx11::string::string((string *)&scriptsig,"",(allocator *)&local_700);
          core::ByteData::ByteData((ByteData *)&local_730);
          core::KeyData::KeyData
                    ((KeyData *)&ref,(Pubkey *)&items,(string *)&scriptsig,(ByteData *)&local_730);
          std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
          emplace_back<cfd::core::KeyData>(&key_list,(KeyData *)&ref);
          core::KeyData::~KeyData((KeyData *)&ref);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_730);
          std::__cxx11::string::~string((string *)&scriptsig);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&items);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_518);
          std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                    ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                     &last_data_1);
        }
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&last_data);
    }
  }
  else {
    if (local_718 == (int64_t *)0x0) {
      puVar4 = *(uint8_t **)(lVar11 + 0x10 + lVar14);
      if (puVar4 != (uint8_t *)0x0) {
        core::ByteData::ByteData
                  ((ByteData *)&scriptsig,puVar4,*(uint32_t *)(lVar11 + 0x18 + lVar14));
        core::Script::Script((Script *)&ref,(ByteData *)&scriptsig);
        core::Script::operator=(&__return_storage_ptr__->redeem_script,(Script *)&ref);
        core::Script::~Script((Script *)&ref);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptsig);
      }
      core::Psbt::GetTxInKeyDataList
                ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&ref,
                 &this->super_Psbt,index);
    }
    else {
      puVar4 = *(uint8_t **)(lVar11 + 0x20 + lVar14);
      if (puVar4 == (uint8_t *)0x0) {
        if (__return_storage_ptr__->address_type == kP2shAddress) {
          AVar9 = kP2shP2wpkhAddress;
          goto LAB_0032c0f9;
        }
      }
      else {
        core::ByteData::ByteData
                  ((ByteData *)&scriptsig,puVar4,*(uint32_t *)(lVar11 + 0x28 + lVar14));
        core::Script::Script((Script *)&ref,(ByteData *)&scriptsig);
        core::Script::operator=(&__return_storage_ptr__->redeem_script,(Script *)&ref);
        core::Script::~Script((Script *)&ref);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptsig);
        if (__return_storage_ptr__->address_type == kP2shAddress) {
          AVar9 = kP2shP2wshAddress;
LAB_0032c0f9:
          __return_storage_ptr__->address_type = AVar9;
        }
      }
      core::Psbt::GetTxInKeyDataList
                ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&ref,
                 &this->super_Psbt,index);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::_M_move_assign
              (&key_list,&ref);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&ref);
    if (*(long *)(*(long *)((long)pvVar2 + 0x10) + 0x50 + lVar14) == 0) goto LAB_0032c95d;
  }
  bVar6 = core::Script::IsP2wpkhScript(this_02);
  if ((bVar6) ||
     ((bVar6 = core::Script::IsP2shScript(this_02), bVar6 &&
      (bVar6 = core::Script::IsEmpty(&__return_storage_ptr__->redeem_script), bVar6)))) {
    if ((long)key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x150) {
      ref._0_8_ = (long)
                  "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_psbt.cpp"
                  + 0x51;
      ref.locking_script_._vptr_Script._0_4_ = 0x34a;
      ref.locking_script_.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "GetUtxoData";
      core::logger::warn<>((CfdSourceLocation *)&ref,"psbt not supported. many pubkey for p2wpkh.");
      pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ref,"psbt not supported. many pubkey for p2wpkh.",
                 (allocator *)&scriptsig);
      core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)&ref);
      __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::KeyData::ToString_abi_cxx11_
              ((string *)&last_data,
               key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
               _M_impl.super__Vector_impl_data._M_start,true,kApostrophe,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scriptsig,
                   "wpkh(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &last_data);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scriptsig,
                   ")");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->descriptor,(string *)&ref);
    std::__cxx11::string::~string((string *)&ref);
    std::__cxx11::string::~string((string *)&scriptsig);
    std::__cxx11::string::~string((string *)&last_data);
    bVar6 = core::Script::IsP2shScript(this_02);
    if (!bVar6) goto LAB_0032c95d;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scriptsig,
                   "sh(",&__return_storage_ptr__->descriptor);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scriptsig,
                   ")");
LAB_0032c935:
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->descriptor,(string *)&ref);
    std::__cxx11::string::~string((string *)&ref);
    pSVar13 = &scriptsig;
  }
  else {
    bVar6 = core::Script::IsP2wshScript(this_02);
    if ((bVar6) || (bVar6 = core::Script::IsP2shScript(this_02), bVar6)) {
      pSVar13 = &__return_storage_ptr__->redeem_script;
      bVar6 = core::Script::IsMultisigScript(pSVar13);
      if (bVar6) {
        items.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        core::ScriptUtil::ExtractPubkeysFromMultisigScript
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&last_data,
                   pSVar13,(uint32_t *)&items);
        std::__cxx11::to_string
                  ((string *)&scriptsig,
                   (uint)items.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        local_6e8 = this_02;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                       "multi(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&scriptsig);
        local_710 = (string *)&__return_storage_ptr__->descriptor;
        std::__cxx11::string::operator=(local_710,(string *)&ref);
        std::__cxx11::string::~string((string *)&ref);
        std::__cxx11::string::~string((string *)&scriptsig);
        local_6e0 = (Pubkey *)
                    last_data.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        for (this_01 = (Pubkey *)
                       last_data.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pKVar5 = key_list.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_finish, this_01 != local_6e0;
            this_01 = this_01 + 1) {
          bVar6 = false;
          for (this_00 = key_list.
                         super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                         ._M_impl.super__Vector_impl_data._M_start; this_00 != pKVar5;
              this_00 = this_00 + 1) {
            core::KeyData::GetPubkey((Pubkey *)&ref,this_00);
            bVar7 = core::Pubkey::Equals(this_01,(Pubkey *)&ref);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ref);
            if (bVar7) {
              core::KeyData::ToString_abi_cxx11_
                        ((string *)&scriptsig,this_00,true,kApostrophe,false);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ref,",",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&scriptsig);
              std::__cxx11::string::append(local_710);
              std::__cxx11::string::~string((string *)&ref);
              std::__cxx11::string::~string((string *)&scriptsig);
              bVar6 = true;
            }
          }
          if (!bVar6) {
            core::Pubkey::GetHex_abi_cxx11_((string *)&scriptsig,this_01);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref
                           ,",",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&scriptsig);
            std::__cxx11::string::append(local_710);
            std::__cxx11::string::~string((string *)&ref);
            std::__cxx11::string::~string((string *)&scriptsig);
          }
        }
        std::__cxx11::string::append((char *)local_710);
        std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&last_data);
        this_02 = local_6e8;
      }
      else {
        bVar6 = core::Script::IsP2pkScript(pSVar13);
        if (bVar6) {
          if ((long)key_list.
                    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)key_list.
                    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0x150) {
            ref._0_8_ = (long)
                        "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_psbt.cpp"
                        + 0x51;
            ref.locking_script_._vptr_Script._0_4_ = 0x36a;
            ref.locking_script_.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = "GetUtxoData";
            core::logger::warn<>
                      ((CfdSourceLocation *)&ref,"psbt not supported. many pubkey for p2pkh.");
            pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string
                      ((string *)&ref,"psbt not supported. many pubkey for p2pkh.",
                       (allocator *)&scriptsig);
            core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)&ref);
            __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          core::KeyData::ToString_abi_cxx11_
                    ((string *)&last_data,
                     key_list.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_start,true,kApostrophe,false);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scriptsig,"pkh(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &last_data);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scriptsig,")");
          std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->descriptor,(string *)&ref);
          std::__cxx11::string::~string((string *)&ref);
          std::__cxx11::string::~string((string *)&scriptsig);
          this_03 = (DescriptorScriptReference *)&last_data;
        }
        else {
          core::Script::GetHex_abi_cxx11_((string *)&ref,pSVar13);
          std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->descriptor);
          this_03 = &ref;
        }
        std::__cxx11::string::~string((string *)this_03);
      }
      if (local_718 != (int64_t *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scriptsig,"wsh(",&__return_storage_ptr__->descriptor);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scriptsig,")");
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->descriptor,(string *)&ref);
        std::__cxx11::string::~string((string *)&ref);
        std::__cxx11::string::~string((string *)&scriptsig);
      }
      bVar6 = core::Script::IsP2shScript(this_02);
      if (!bVar6) goto LAB_0032c95d;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scriptsig
                     ,"sh(",&__return_storage_ptr__->descriptor);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scriptsig
                     ,")");
      goto LAB_0032c935;
    }
    bVar6 = core::Script::IsP2pkhScript(this_02);
    if (!bVar6) goto LAB_0032c95d;
    if ((long)key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x150) {
      ref._0_8_ = (long)
                  "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_psbt.cpp"
                  + 0x51;
      ref.locking_script_._vptr_Script._0_4_ = 0x37c;
      ref.locking_script_.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "GetUtxoData";
      core::logger::warn<>((CfdSourceLocation *)&ref,"psbt not supported. many pubkey for p2pkh.");
      pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ref,"psbt not supported. many pubkey for p2pkh.",(allocator *)&scriptsig
                );
      core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)&ref);
      __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::KeyData::ToString_abi_cxx11_
              ((string *)&last_data,
               key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
               _M_impl.super__Vector_impl_data._M_start,true,kApostrophe,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scriptsig,
                   "pkh(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &last_data);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scriptsig,
                   ")");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->descriptor,(string *)&ref);
    std::__cxx11::string::~string((string *)&ref);
    std::__cxx11::string::~string((string *)&scriptsig);
    pSVar13 = (Script *)&last_data;
  }
  std::__cxx11::string::~string((string *)pSVar13);
LAB_0032c95d:
  if ((__return_storage_ptr__->descriptor)._M_string_length != 0) {
    core::Descriptor::Parse
              ((Descriptor *)&last_data,&__return_storage_ptr__->descriptor,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0);
    core::Descriptor::GetReference
              (&ref,(Descriptor *)&last_data,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    core::DescriptorScriptReference::GetLockingScript(&scriptsig,&ref);
    bVar6 = core::Script::Equals(&scriptsig,this_02);
    core::Script::~Script(&scriptsig);
    if (!bVar6) {
      scriptsig._vptr_Script = (_func_int **)0x4f80a9;
      scriptsig.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x38b;
      scriptsig.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = "GetUtxoData";
      core::logger::warn<>
                ((CfdSourceLocation *)&scriptsig,
                 "psbt invalid state. unmatch descriptor & lockingScript.");
      pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&scriptsig,"psbt invalid state. unmatch descriptor & lockingScript.",
                 (allocator *)&items);
      core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)&scriptsig);
      __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::DescriptorScriptReference::GenerateAddress((Address *)&scriptsig,&ref,local_704);
    core::Address::operator=(&__return_storage_ptr__->address,(Address *)&scriptsig);
    core::Address::~Address((Address *)&scriptsig);
    AVar9 = core::DescriptorScriptReference::GetAddressType(&ref);
    __return_storage_ptr__->address_type = AVar9;
    core::DescriptorScriptReference::~DescriptorScriptReference(&ref);
    core::DescriptorNode::~DescriptorNode((DescriptorNode *)&last_data);
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
  return __return_storage_ptr__;
}

Assistant:

UtxoData Psbt::GetUtxoData(uint32_t index, NetType net_type) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
  UtxoData utxo;
  utxo.block_height = 0;
  utxo.address_type = AddressType::kP2shAddress;

  utxo.txid = Txid(ByteData256(ByteData(
      psbt_pointer->tx->inputs[index].txhash,
      sizeof(psbt_pointer->tx->inputs[index].txhash))));
  utxo.vout = psbt_pointer->tx->inputs[index].index;

  bool witness_only = false;
  if (psbt_pointer->inputs[index].witness_utxo != nullptr) {
    utxo.amount = Amount(static_cast<int64_t>(
        psbt_pointer->inputs[index].witness_utxo->satoshi));
    utxo.locking_script = Script(ByteData(
        psbt_pointer->inputs[index].witness_utxo->script,
        static_cast<uint32_t>(
            psbt_pointer->inputs[index].witness_utxo->script_len)));
    witness_only = true;
  } else if (psbt_pointer->inputs[index].utxo != nullptr) {
    if (psbt_pointer->inputs[index].utxo->num_outputs > utxo.vout) {
      auto output = &psbt_pointer->inputs[index].utxo->outputs[utxo.vout];
      utxo.amount = Amount(static_cast<int64_t>(output->satoshi));
      utxo.locking_script = Script(
          ByteData(output->script, static_cast<uint32_t>(output->script_len)));
    }
  }
  if (utxo.locking_script.IsP2shScript()) {
    utxo.address_type = AddressType::kP2shAddress;
  } else if (utxo.locking_script.IsP2pkhScript()) {
    utxo.address_type = AddressType::kP2pkhAddress;
  } else if (utxo.locking_script.IsP2wpkhScript()) {
    utxo.address_type = AddressType::kP2wpkhAddress;
  } else if (utxo.locking_script.IsP2wshScript()) {
    utxo.address_type = AddressType::kP2wshAddress;
  }

  std::vector<KeyData> key_list;
  bool is_finalized = IsFinalizedInput(index);
  if (is_finalized) {
    if (witness_only &&
        (psbt_pointer->inputs[index].final_witness != nullptr)) {
      auto witness_stack = psbt_pointer->inputs[index].final_witness;
      uint32_t last_index = static_cast<uint32_t>(witness_stack->num_items);
      if (last_index > 0) {
        ByteData last_data(
            witness_stack->items[last_index - 1].witness,
            static_cast<uint32_t>(
                witness_stack->items[last_index - 1].witness_len));
        if (Pubkey::IsValid(last_data)) {
          key_list.emplace_back(KeyData(Pubkey(last_data), "", ByteData()));
          if (utxo.address_type == AddressType::kP2shAddress) {
            utxo.address_type = AddressType::kP2shP2wpkhAddress;
          }
        } else {
          utxo.redeem_script = Script(last_data);
          if (utxo.address_type == AddressType::kP2shAddress) {
            utxo.address_type = AddressType::kP2shP2wshAddress;
          }
          if (utxo.redeem_script.IsP2pkScript()) {
            key_list.emplace_back(KeyData(
                Pubkey(utxo.redeem_script.GetElementList()[0].GetData()), "",
                ByteData()));
          }
        }
      }
    } else if (psbt_pointer->inputs[index].final_scriptsig != nullptr) {
      Script scriptsig(ByteData(
          psbt_pointer->inputs[index].final_scriptsig,
          static_cast<uint32_t>(
              psbt_pointer->inputs[index].final_scriptsig_len)));
      auto items = scriptsig.GetElementList();
      uint32_t last_index = static_cast<uint32_t>(items.size());
      if (last_index > 0) {
        ByteData last_data = items[last_index - 1].GetBinaryData();
        if (Pubkey::IsValid(last_data)) {
          key_list.emplace_back(KeyData(Pubkey(last_data), "", ByteData()));
        } else {
          utxo.redeem_script = Script(last_data);
          if (utxo.redeem_script.IsP2pkScript()) {
            key_list.emplace_back(KeyData(
                Pubkey(utxo.redeem_script.GetElementList()[0].GetData()), "",
                ByteData()));
          }
        }
      }
    }
  } else if (witness_only) {
    if (psbt_pointer->inputs[index].witness_script != nullptr) {
      utxo.redeem_script = Script(ByteData(
          psbt_pointer->inputs[index].witness_script,
          static_cast<uint32_t>(
              psbt_pointer->inputs[index].witness_script_len)));
      if (utxo.address_type == AddressType::kP2shAddress) {
        utxo.address_type = AddressType::kP2shP2wshAddress;
      }
    } else if (utxo.address_type == AddressType::kP2shAddress) {
      utxo.address_type = AddressType::kP2shP2wpkhAddress;
    }

    key_list = cfd::core::Psbt::GetTxInKeyDataList(index);
  } else {
    if (psbt_pointer->inputs[index].redeem_script != nullptr) {
      utxo.redeem_script = Script(ByteData(
          psbt_pointer->inputs[index].redeem_script,
          static_cast<uint32_t>(
              psbt_pointer->inputs[index].redeem_script_len)));
    }
    key_list = cfd::core::Psbt::GetTxInKeyDataList(index);
  }

  if ((!is_finalized) &&
      (psbt_pointer->inputs[index].keypaths.num_items == 0)) {
    // unset descriptor
  } else if (
      utxo.locking_script.IsP2wpkhScript() ||
      (utxo.locking_script.IsP2shScript() && utxo.redeem_script.IsEmpty())) {
    if (key_list.size() != 1) {
      warn(CFD_LOG_SOURCE, "psbt not supported. many pubkey for p2wpkh.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "psbt not supported. many pubkey for p2wpkh.");
    }
    utxo.descriptor = "wpkh(" + key_list[0].ToString() + ")";
    if (utxo.locking_script.IsP2shScript()) {
      utxo.descriptor = "sh(" + utxo.descriptor + ")";
    }
  } else if (
      utxo.locking_script.IsP2wshScript() ||
      utxo.locking_script.IsP2shScript()) {
    if (utxo.redeem_script.IsMultisigScript()) {
      uint32_t req_num = 0;
      auto multisig_key_list = ScriptUtil::ExtractPubkeysFromMultisigScript(
          utxo.redeem_script, &req_num);
      utxo.descriptor = "multi(" + std::to_string(req_num);
      for (const auto& pubkey : multisig_key_list) {
        bool is_find = false;
        for (const auto& key : key_list) {
          if (pubkey.Equals(key.GetPubkey())) {
            utxo.descriptor += "," + key.ToString();
            is_find = true;
          }
        }
        if (!is_find) {
          utxo.descriptor += "," + pubkey.GetHex();
        }
      }
      utxo.descriptor += ")";
    } else if (utxo.redeem_script.IsP2pkScript()) {
      if (key_list.size() != 1) {
        warn(CFD_LOG_SOURCE, "psbt not supported. many pubkey for p2pkh.");
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "psbt not supported. many pubkey for p2pkh.");
      }
      utxo.descriptor = "pkh(" + key_list[0].ToString() + ")";
    } else {
      // not key support
      utxo.descriptor = utxo.redeem_script.GetHex();
    }
    if (witness_only) {
      utxo.descriptor = "wsh(" + utxo.descriptor + ")";
    }
    if (utxo.locking_script.IsP2shScript()) {
      utxo.descriptor = "sh(" + utxo.descriptor + ")";
    }
  } else if (utxo.locking_script.IsP2pkhScript()) {
    if (key_list.size() != 1) {
      warn(CFD_LOG_SOURCE, "psbt not supported. many pubkey for p2pkh.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "psbt not supported. many pubkey for p2pkh.");
    }
    utxo.descriptor = "pkh(" + key_list[0].ToString() + ")";
  } else {
    // unsupported format
  }

  if (!utxo.descriptor.empty()) {
    Descriptor desc = Descriptor::Parse(utxo.descriptor);
    auto ref = desc.GetReference();
    if (!ref.GetLockingScript().Equals(utxo.locking_script)) {
      warn(
          CFD_LOG_SOURCE,
          "psbt invalid state. unmatch descriptor & lockingScript.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "psbt invalid state. unmatch descriptor & lockingScript.");
    }
    utxo.address = ref.GenerateAddress(net_type);
    utxo.address_type = ref.GetAddressType();
  }

  return utxo;
}